

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O0

endpoint_type * __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,error_code *ec)

{
  int iVar1;
  data_type *__addr;
  int *in_RDX;
  endpoint_type *in_RDI;
  size_t addr_len;
  endpoint_type endpoint;
  basic_endpoint<asio::ip::tcp> *in_stack_ffffffffffffff98;
  endpoint_type *this_00;
  size_t local_48 [6];
  int *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  ip::basic_endpoint<asio::ip::tcp>::basic_endpoint((basic_endpoint<asio::ip::tcp> *)0x291a0f);
  local_48[0] = ip::basic_endpoint<asio::ip::tcp>::capacity
                          ((basic_endpoint<asio::ip::tcp> *)0x291a19);
  iVar1 = *local_18;
  __addr = ip::basic_endpoint<asio::ip::tcp>::data((basic_endpoint<asio::ip::tcp> *)0x291a33);
  iVar1 = socket_ops::getpeername(iVar1,(sockaddr *)__addr,(socklen_t *)local_48);
  if (iVar1 == 0) {
    ip::basic_endpoint<asio::ip::tcp>::resize(this_00,(size_t)in_stack_ffffffffffffff98);
    ip::basic_endpoint<asio::ip::tcp>::basic_endpoint(this_00,in_stack_ffffffffffffff98);
  }
  else {
    ip::basic_endpoint<asio::ip::tcp>::basic_endpoint((basic_endpoint<asio::ip::tcp> *)0x291a5a);
  }
  return in_RDI;
}

Assistant:

endpoint_type remote_endpoint(const implementation_type& impl,
      asio::error_code& ec) const
  {
    endpoint_type endpoint;
    std::size_t addr_len = endpoint.capacity();
    if (socket_ops::getpeername(impl.socket_,
          endpoint.data(), &addr_len, false, ec))
    {
      ASIO_ERROR_LOCATION(ec);
      return endpoint_type();
    }
    endpoint.resize(addr_len);
    return endpoint;
  }